

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

void __thiscall tinyusdz::usdc::USDCReader::Impl::PushError(Impl *this,string *s)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + s->_M_string_length);
  ::std::__cxx11::string::_M_append((char *)local_40,(ulong)(this->_err)._M_dataplus._M_p);
  ::std::__cxx11::string::operator=((string *)&this->_err,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void PushError(const std::string &s) { _err = s + _err; }